

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O2

void variance128_avx2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int h,__m256i *vsse,
                     __m256i *vsum)

{
  __m256i *sse;
  undefined4 in_register_00000084;
  int iVar1;
  bool bVar2;
  
  sse = (__m256i *)CONCAT44(in_register_00000084,h);
  (*vsse)[0] = 0;
  (*vsse)[1] = 0;
  (*vsse)[2] = 0;
  (*vsse)[3] = 0;
  iVar1 = 0x10;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    variance32_kernel_avx2(src,ref,sse,vsse);
    variance32_kernel_avx2(src + 0x20,ref + 0x20,sse,vsse);
    variance32_kernel_avx2(src + 0x40,ref + 0x40,sse,vsse);
    variance32_kernel_avx2(src + 0x60,ref + 0x60,sse,vsse);
    src = src + src_stride;
    ref = ref + ref_stride;
  }
  return;
}

Assistant:

static inline void variance128_avx2(const uint8_t *src, const int src_stride,
                                    const uint8_t *ref, const int ref_stride,
                                    const int h, __m256i *const vsse,
                                    __m256i *const vsum) {
  *vsum = _mm256_setzero_si256();

  for (int i = 0; i < h; i++) {
    variance32_kernel_avx2(src + 0, ref + 0, vsse, vsum);
    variance32_kernel_avx2(src + 32, ref + 32, vsse, vsum);
    variance32_kernel_avx2(src + 64, ref + 64, vsse, vsum);
    variance32_kernel_avx2(src + 96, ref + 96, vsse, vsum);
    src += src_stride;
    ref += ref_stride;
  }
}